

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer_yin.c
# Opt level: O0

void yprp_choice(lys_ypr_ctx_conflict *pctx,lysp_node *node)

{
  lysp_node_choice *choice;
  lysp_node *child;
  lysp_node *plStack_18;
  int8_t flag;
  lysp_node *node_local;
  lys_ypr_ctx_conflict *pctx_local;
  
  child._7_1_ = '\0';
  plStack_18 = node;
  node_local = (lysp_node *)pctx;
  yprp_node_common1(pctx,node,(int8_t *)((long)&child + 7));
  if (node[1].next != (lysp_node *)0x0) {
    ypr_close_parent((lys_ypr_ctx_conflict *)node_local,(int8_t *)((long)&child + 7));
    ypr_substmt((lys_ypr_ctx_conflict *)node_local,LY_STMT_DEFAULT,'\0',(char *)node[1].next,
                node->exts);
  }
  yprp_node_common2((lys_ypr_ctx_conflict *)node_local,plStack_18,(int8_t *)((long)&child + 7));
  for (choice = (lysp_node_choice *)node[1].parent; choice != (lysp_node_choice *)0x0;
      choice = (lysp_node_choice *)(choice->field_0).node.next) {
    ypr_close_parent((lys_ypr_ctx_conflict *)node_local,(int8_t *)((long)&child + 7));
    yprp_node((lys_ypr_ctx_conflict *)node_local,(lysp_node *)choice);
  }
  node_local->nodetype = node_local->nodetype - 1;
  ypr_close((lys_ypr_ctx_conflict *)node_local,"choice",child._7_1_);
  return;
}

Assistant:

static void
yprp_choice(struct lys_ypr_ctx *pctx, const struct lysp_node *node)
{
    int8_t flag = 0;
    struct lysp_node *child;
    struct lysp_node_choice *choice = (struct lysp_node_choice *)node;

    yprp_node_common1(pctx, node, &flag);

    if (choice->dflt.str) {
        ypr_close_parent(pctx, &flag);
        ypr_substmt(pctx, LY_STMT_DEFAULT, 0, choice->dflt.str, choice->exts);
    }

    yprp_node_common2(pctx, node, &flag);

    LY_LIST_FOR(choice->child, child) {
        ypr_close_parent(pctx, &flag);
        yprp_node(pctx, child);
    }

    LEVEL--;
    ypr_close(pctx, "choice", flag);
}